

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O2

void __thiscall Movegen::Movegen(Movegen *this,position *pos)

{
  long lVar1;
  
  this->last = 0;
  lVar1 = 6;
  do {
    *(undefined2 *)((long)(this->list + -2) + lVar1) = 0;
    *(undefined1 *)((long)this->list + lVar1 + -4) = 0x11;
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x294);
  (this->queen_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queen_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rook_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rook_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bishop_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rook_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bishop_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bishop_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->queen_mvs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialize(this,pos);
  return;
}

Assistant:

Movegen(const position& pos) : last(0) { initialize(pos); }